

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# split.hpp
# Opt level: O0

pair<std::basic_string_view<char32_t,_std::char_traits<char32_t>_>,_std::basic_string_view<char32_t,_std::char_traits<char32_t>_>_>
* __thiscall
jessilib::
split_once<std::basic_string_view<char32_t,std::char_traits<char32_t>>,char32_t_const*,char32_t_const*,char32_t>
          (pair<std::basic_string_view<char32_t,_std::char_traits<char32_t>_>,_std::basic_string_view<char32_t,_std::char_traits<char32_t>_>_>
           *__return_storage_ptr__,jessilib *this,char32_t *begin,char32_t *end,char32_t in_delim)

{
  basic_string_view<char32_t,_std::char_traits<char32_t>_> bVar1;
  size_t local_78;
  char32_t *local_70;
  size_t local_68;
  char32_t *local_60;
  char32_t *local_58;
  char32_t *local_50;
  jessilib *local_48;
  char32_t *itr;
  pair<std::basic_string_view<char32_t,_std::char_traits<char32_t>_>,_std::basic_string_view<char32_t,_std::char_traits<char32_t>_>_>
  result;
  char32_t in_delim_local;
  char32_t *end_local;
  char32_t *begin_local;
  
  result.second._M_str._4_4_ = (int)end;
  std::
  pair<std::basic_string_view<char32_t,_std::char_traits<char32_t>_>,_std::basic_string_view<char32_t,_std::char_traits<char32_t>_>_>
  ::
  pair<std::basic_string_view<char32_t,_std::char_traits<char32_t>_>,_std::basic_string_view<char32_t,_std::char_traits<char32_t>_>,_true>
            ((pair<std::basic_string_view<char32_t,_std::char_traits<char32_t>_>,_std::basic_string_view<char32_t,_std::char_traits<char32_t>_>_>
              *)&itr);
  local_48 = this;
  if (this < begin) {
    for (; local_48 != (jessilib *)begin; local_48 = local_48 + 4) {
      if (*(int *)local_48 == result.second._M_str._4_4_) {
        bVar1 = make_split_member<std::basic_string_view<char32_t,_std::char_traits<char32_t>_>,_const_char32_t_*,_const_char32_t_*,_nullptr>
                          ((char32_t *)this,(char32_t *)local_48);
        local_58 = (char32_t *)bVar1._M_len;
        itr = local_58;
        local_50 = bVar1._M_str;
        result.first._M_len = (size_t)local_50;
        bVar1 = make_split_member<std::basic_string_view<char32_t,_std::char_traits<char32_t>_>,_const_char32_t_*,_const_char32_t_*,_nullptr>
                          ((char32_t *)(local_48 + 4),begin);
        local_68 = bVar1._M_len;
        local_60 = bVar1._M_str;
        (__return_storage_ptr__->first)._M_len = (size_t)itr;
        (__return_storage_ptr__->first)._M_str = (char32_t *)result.first._M_len;
        (__return_storage_ptr__->second)._M_len = local_68;
        (__return_storage_ptr__->second)._M_str = local_60;
        return __return_storage_ptr__;
      }
    }
    bVar1 = make_split_member<std::basic_string_view<char32_t,_std::char_traits<char32_t>_>,_const_char32_t_*,_const_char32_t_*,_nullptr>
                      ((char32_t *)this,begin);
    local_78 = bVar1._M_len;
    local_70 = bVar1._M_str;
    (__return_storage_ptr__->first)._M_len = local_78;
    (__return_storage_ptr__->first)._M_str = local_70;
    (__return_storage_ptr__->second)._M_len = (size_t)result.first._M_str;
    (__return_storage_ptr__->second)._M_str = (char32_t *)result.second._M_len;
  }
  else {
    (__return_storage_ptr__->first)._M_len = (size_t)itr;
    (__return_storage_ptr__->first)._M_str = (char32_t *)result.first._M_len;
    (__return_storage_ptr__->second)._M_len = (size_t)result.first._M_str;
    (__return_storage_ptr__->second)._M_str = (char32_t *)result.second._M_len;
  }
  return __return_storage_ptr__;
}

Assistant:

constexpr auto split_once(ItrT begin, EndT end, ElementT in_delim) {
	static_assert(sizeof...(OptionalMemberT) <= 1, "Too many member types specified for OptionalMemberT");
	using MemberT = std::tuple_element_t<0, std::tuple<OptionalMemberT..., std::basic_string<ElementT>>>;

	std::pair<MemberT, MemberT> result;
	if (begin >= end) {
		// Nothing to split
		return result;
	}

	for (auto itr = begin; itr != end; ++itr) {
		if (*itr == in_delim) {
			// in_delim found; split upon it
			result.first = make_split_member<MemberT>(begin, itr);
			result.second = make_split_member<MemberT>(itr + 1, end);
			return result;
		}
	}

	// in_delim not found
	result.first = make_split_member<MemberT>(begin, end);
	return result;
}